

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

void qpdfjob_register_progress_reporter
               (qpdfjob_handle j,_func_void_int_void_ptr *report_progress,void *data)

{
  _Bind<void_(*(std::_Placeholder<1>,_void_*))(int,_void_*)> local_50;
  function<void_(int)> local_40;
  void *local_20;
  void *data_local;
  _func_void_int_void_ptr *report_progress_local;
  qpdfjob_handle j_local;
  
  local_20 = data;
  data_local = report_progress;
  report_progress_local = (_func_void_int_void_ptr *)j;
  std::bind<void(*&)(int,void*),std::_Placeholder<1>const&,void*&>
            (&local_50._M_f,(_Placeholder<1> *)&data_local,(void **)&std::placeholders::_1);
  std::function<void(int)>::
  function<std::_Bind<void(*(std::_Placeholder<1>,void*))(int,void*)>,void>
            ((function<void(int)> *)&local_40,&local_50);
  QPDFJob::registerProgressReporter(&j->j,&local_40);
  std::function<void_(int)>::~function(&local_40);
  return;
}

Assistant:

void
qpdfjob_register_progress_reporter(
    qpdfjob_handle j, void (*report_progress)(int percent, void* data), void* data)
{
    j->j.registerProgressReporter(std::bind(report_progress, std::placeholders::_1, data));
}